

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_method(PPOPCNT_U16_METHODS method,uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort *puVar1;
  ulong uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  
  switch(method) {
  case PPOPCNT_AUTO:
    pospopcnt_u16(data,len,flags);
    break;
  case PPOPCNT_SCALAR:
    if (len == 0) {
      return 0;
    }
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar6 = vpmovsxbd_avx512f(_DAT_00115080);
    auVar3 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      auVar4 = vpbroadcastd_avx512f();
      auVar4 = vpsrlvd_avx512f(auVar4,auVar6);
      auVar4 = vpandd_avx512f(auVar4,auVar3);
      auVar5 = vpaddd_avx512f(auVar4,auVar5);
    } while (len != uVar2);
    goto LAB_001065a0;
  case PPOPCNT_SCALAR_NOSIMD:
    if (len == 0) {
      return 0;
    }
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar6 = vpmovsxbd_avx512f(_DAT_00115080);
    auVar3 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      auVar4 = vpbroadcastd_avx512f();
      auVar4 = vpsrlvd_avx512f(auVar4,auVar6);
      auVar4 = vpandd_avx512f(auVar4,auVar3);
      auVar5 = vpaddd_avx512f(auVar4,auVar5);
    } while (len != uVar2);
    goto LAB_001065a0;
  case PPOPCNT_SCALAR_PARTITION:
    pospopcnt_u16_scalar_partition(data,len,flags);
    break;
  case PPOPCNT_SCALAR_HIST1X4:
    pospopcnt_u16_scalar_hist1x4(data,len,flags);
    break;
  case PPOPCNT_SCALAR_UMUL128:
    pospopcnt_u16_scalar_umul128(data,len,flags);
    break;
  case PPOPCNT_SCALAR_UMUL128_UR2:
    pospopcnt_u16_scalar_umul128_unroll2(data,len,flags);
    break;
  case PPOPCNT_SSE_SINGLE:
    pospopcnt_u16_sse_single(data,len,flags);
    break;
  case PPOPCNT_SSE_BLEND_POPCNT:
    pospopcnt_u16_sse_blend_popcnt(data,len,flags);
    break;
  case PPOPCNT_SSE_BLEND_POPCNT_UR4:
    pospopcnt_u16_sse_blend_popcnt_unroll4(data,len,flags);
    break;
  case PPOPCNT_SSE_BLEND_POPCNT_UR8:
    pospopcnt_u16_sse_blend_popcnt_unroll8(data,len,flags);
    break;
  case PPOPCNT_SSE_BLEND_POPCNT_UR16:
    pospopcnt_u16_sse_blend_popcnt_unroll16(data,len,flags);
    break;
  case PPOPCNT_SSE_SAD:
    pospopcnt_u16_sse_sad(data,len,flags);
    break;
  case PPOPCNT_SSE_HARVEY_SEAL:
    pospopcnt_u16_sse_harvey_seal(data,len,flags);
    break;
  case PPOPCNT_AVX2_POPCNT:
    pospopcnt_u16_avx2_popcnt(data,len,flags);
    break;
  case PPOPCNT_AVX2:
    pospopcnt_u16_avx2(data,len,flags);
    break;
  case PPOPCNT_AVX2_POPCNT_NAIVE:
    pospopcnt_u16_avx2_naive_counter(data,len,flags);
    break;
  case PPOPCNT_AVX2_SINGLE:
    pospopcnt_u16_avx2_single(data,len,flags);
    break;
  case PPOPCNT_AVX2_LEMIRE1:
    pospopcnt_u16_avx2_lemire(data,len,flags);
    break;
  case PPOPCNT_AVX2_LEMIRE2:
    pospopcnt_u16_avx2_lemire2(data,len,flags);
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT:
    pospopcnt_u16_avx2_blend_popcnt(data,len,flags);
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT_UR4:
    pospopcnt_u16_avx2_blend_popcnt_unroll4(data,len,flags);
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT_UR8:
    pospopcnt_u16_avx2_blend_popcnt_unroll8(data,len,flags);
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT_UR16:
    pospopcnt_u16_avx2_blend_popcnt_unroll16(data,len,flags);
    break;
  case PPOPCNT_AVX2_ADDER_FOREST:
    pospopcnt_u16_avx2_adder_forest(data,len,flags);
    break;
  case PPOPCNT_AVX2_HARVEY_SEAL:
    pospopcnt_u16_avx2_harvey_seal(data,len,flags);
    break;
  case PPOPCNT_AVX512:
    pospopcnt_u16_avx512(data,len,flags);
    break;
  case PPOPCNT_AVX512BW_MASK32:
    pospopcnt_u16_avx512bw_popcnt32_mask(data,len,flags);
    break;
  case PPOPCNT_AVX512BW_MASK64:
    pospopcnt_u16_avx512bw_popcnt64_mask(data,len,flags);
    break;
  case PPOSCNT_AVX512_MASKED_OPS:
    if (len == 0) {
      auVar5 = ZEXT1664((undefined1  [16])0x0);
    }
    else {
      auVar5 = ZEXT1664((undefined1  [16])0x0);
      uVar2 = 0;
      do {
        puVar1 = data + uVar2;
        uVar2 = uVar2 + 1;
        auVar6 = vpmovm2d_avx512dq((ulong)*puVar1);
        auVar5 = vpsubd_avx512f(auVar5,auVar6);
      } while (len != uVar2);
    }
LAB_001065a0:
    auVar5 = vmovdqu64_avx512f(auVar5);
    *(undefined1 (*) [64])flags = auVar5;
    break;
  case PPOPCNT_AVX512_POPCNT:
    pospopcnt_u16_avx512_popcnt(data,len,flags);
    break;
  case PPOPCNT_AVX512BW_BLEND_POPCNT:
    pospopcnt_u16_avx512bw_blend_popcnt(data,len,flags);
    break;
  case PPOPCNT_AVX512BW_BLEND_POPCNT_UR4:
    pospopcnt_u16_avx512bw_blend_popcnt_unroll4(data,len,flags);
    break;
  case PPOPCNT_AVX512BW_BLEND_POPCNT_UR8:
    pospopcnt_u16_avx512bw_blend_popcnt_unroll8(data,len,flags);
    break;
  case PPOPCNT_AVX512_MULA2:
    pospopcnt_u16_avx512_mula2(data,len,flags);
    break;
  case PPOPCNT_AVX512BW_ADDER_FOREST:
    pospopcnt_u16_avx512bw_adder_forest(data,len,flags);
    break;
  case PPOPCNT_AVX512BW_HARVEY_SEAL:
    pospopcnt_u16_avx512bw_harvey_seal(data,len,flags);
    break;
  case PPOPCNT_AVX512VBMI_HARVEY_SEAL:
    pospopcnt_u16_avx512vbmi_harvey_seal(data,len,flags);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_method(PPOPCNT_U16_METHODS method, const uint16_t* data, uint32_t len, uint32_t* flags) {
    switch(method) {
    case(PPOPCNT_AUTO): return pospopcnt_u16(data, len, flags);
    case(PPOPCNT_SCALAR): return pospopcnt_u16_scalar_naive(data, len, flags);
    case(PPOPCNT_SCALAR_NOSIMD): return pospopcnt_u16_scalar_naive_nosimd(data, len, flags);
    case(PPOPCNT_SCALAR_PARTITION): return pospopcnt_u16_scalar_partition(data, len, flags);
    case(PPOPCNT_SCALAR_HIST1X4): return pospopcnt_u16_scalar_hist1x4(data, len, flags);
    case(PPOPCNT_SCALAR_UMUL128): return pospopcnt_u16_scalar_umul128(data, len, flags);
    case(PPOPCNT_SCALAR_UMUL128_UR2): return pospopcnt_u16_scalar_umul128_unroll2(data, len, flags);
    case(PPOPCNT_SSE_SINGLE): return pospopcnt_u16_sse_single(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT): return pospopcnt_u16_sse_blend_popcnt(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT_UR4): return pospopcnt_u16_sse_blend_popcnt_unroll4(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT_UR8): return pospopcnt_u16_sse_blend_popcnt_unroll8(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT_UR16): return pospopcnt_u16_sse_blend_popcnt_unroll16(data, len, flags);
    case(PPOPCNT_SSE_SAD): return pospopcnt_u16_sse_sad(data, len, flags);
    case(PPOPCNT_SSE_HARVEY_SEAL): return pospopcnt_u16_sse_harvey_seal(data, len, flags);
    case(PPOPCNT_AVX2_POPCNT): return pospopcnt_u16_avx2_popcnt(data, len, flags);
    case(PPOPCNT_AVX2): return pospopcnt_u16_avx2(data, len, flags);
    case(PPOPCNT_AVX2_POPCNT_NAIVE): return pospopcnt_u16_avx2_naive_counter(data, len, flags);
    case(PPOPCNT_AVX2_SINGLE): return pospopcnt_u16_avx2_single(data, len, flags);
    case(PPOPCNT_AVX2_LEMIRE1): return pospopcnt_u16_avx2_lemire(data, len, flags);
    case(PPOPCNT_AVX2_LEMIRE2): return pospopcnt_u16_avx2_lemire2(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT): return pospopcnt_u16_avx2_blend_popcnt(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR4): return pospopcnt_u16_avx2_blend_popcnt_unroll4(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR8): return pospopcnt_u16_avx2_blend_popcnt_unroll8(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR16): return pospopcnt_u16_avx2_blend_popcnt_unroll16(data, len, flags);
    case(PPOPCNT_AVX2_ADDER_FOREST): return pospopcnt_u16_avx2_adder_forest(data, len, flags);
    case(PPOPCNT_AVX2_HARVEY_SEAL): return pospopcnt_u16_avx2_harvey_seal(data, len, flags);
    case(PPOPCNT_AVX512): return pospopcnt_u16_avx512(data, len, flags);
    case(PPOPCNT_AVX512BW_MASK32): return pospopcnt_u16_avx512bw_popcnt32_mask(data, len, flags);
    case(PPOPCNT_AVX512BW_MASK64): return pospopcnt_u16_avx512bw_popcnt64_mask(data, len, flags);
    case(PPOSCNT_AVX512_MASKED_OPS): return pospopcnt_u16_avx512_masked_ops(data, len, flags);
    case(PPOPCNT_AVX512_POPCNT): return pospopcnt_u16_avx512_popcnt(data, len, flags);
    case(PPOPCNT_AVX512BW_BLEND_POPCNT): return pospopcnt_u16_avx512bw_blend_popcnt(data, len, flags);
    case(PPOPCNT_AVX512BW_BLEND_POPCNT_UR4): return pospopcnt_u16_avx512bw_blend_popcnt_unroll4(data, len, flags);
    case(PPOPCNT_AVX512BW_BLEND_POPCNT_UR8): return pospopcnt_u16_avx512bw_blend_popcnt_unroll8(data, len, flags);
    case(PPOPCNT_AVX512BW_ADDER_FOREST): return pospopcnt_u16_avx512bw_adder_forest(data, len, flags);
    case(PPOPCNT_AVX512_MULA2): return pospopcnt_u16_avx512_mula2(data, len, flags);
    case(PPOPCNT_AVX512BW_HARVEY_SEAL): return pospopcnt_u16_avx512bw_harvey_seal(data, len, flags);
    case(PPOPCNT_AVX512VBMI_HARVEY_SEAL): return pospopcnt_u16_avx512vbmi_harvey_seal(data, len, flags);
    }
    assert(0);
    return 0; /* unreachable, but some compilers complain without it */
}